

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

objc_property_t *
protocol_copyPropertyList2
          (Protocol *p,uint *outCount,BOOL isRequiredProperty,BOOL isInstanceProperty)

{
  BOOL BVar1;
  objc_property *poVar2;
  objc_property_list *local_78;
  objc_property_list *local_70;
  objc_property_list *local_68;
  int local_5c;
  objc_property_list *poStack_58;
  int i;
  objc_property_list *l_1;
  uint out;
  objc_property_t *list;
  objc_property_list *l;
  uint count;
  objc_property_list *properties;
  BOOL isInstanceProperty_local;
  BOOL isRequiredProperty_local;
  uint *outCount_local;
  Protocol *p_local;
  
  if (isInstanceProperty == '\0') {
    if (isRequiredProperty == '\0') {
      local_78 = p->optional_class_properties;
    }
    else {
      local_78 = p->class_properties;
    }
    local_70 = local_78;
  }
  else {
    if (isRequiredProperty == '\0') {
      local_68 = p->optional_properties;
    }
    else {
      local_68 = p->properties;
    }
    local_70 = local_68;
  }
  if (p == (Protocol *)0x0) {
    p_local = (Protocol *)0x0;
  }
  else {
    if (((isRequiredProperty == '\0') && (isInstanceProperty == '\0')) &&
       (BVar1 = protocol_hasOptionalMethodsAndProperties(p), BVar1 == '\0')) {
      return (objc_property_t *)0x0;
    }
    if (local_70 == (objc_property_list *)0x0) {
      p_local = (Protocol *)0x0;
    }
    else {
      l._4_4_ = 0;
      for (list = (objc_property_t *)local_70; list != (objc_property_t *)0x0;
          list = (objc_property_t *)list[1]) {
        l._4_4_ = *(int *)list + l._4_4_;
      }
      if (l._4_4_ == 0) {
        p_local = (Protocol *)0x0;
      }
      else {
        p_local = (Protocol *)calloc(8,(ulong)l._4_4_);
        l_1._4_4_ = 0;
        for (poStack_58 = local_70; poStack_58 != (objc_property_list *)0x0;
            poStack_58 = poStack_58->next) {
          for (local_5c = 0; local_5c < poStack_58->count; local_5c = local_5c + 1) {
            poVar2 = property_at_index(poStack_58,local_5c);
            (&p_local->isa)[l_1._4_4_] = (id)poVar2;
            l_1._4_4_ = l_1._4_4_ + 1;
          }
        }
        *outCount = l._4_4_;
      }
    }
  }
  return (objc_property_t *)p_local;
}

Assistant:

objc_property_t *protocol_copyPropertyList2(Protocol *p, unsigned int *outCount,
		BOOL isRequiredProperty, BOOL isInstanceProperty)
{
	struct objc_property_list *properties =
	    isInstanceProperty ?
	        (isRequiredProperty ? p->properties : p->optional_properties) :
	        (isRequiredProperty ? p->class_properties : p->optional_class_properties);
	if (NULL == p) { return NULL; }
	// If it's an old protocol, it won't have any of the other options.
	if (!isRequiredProperty && !isInstanceProperty &&
	    !protocol_hasOptionalMethodsAndProperties(p))
	{
		return NULL;
	}
	if (properties == NULL)
	{
		return NULL;
	}
	unsigned int count = 0;
	for (struct objc_property_list *l=properties ; l!=NULL ; l=l->next)
	{
		count += l->count;
	}
	if (0 == count)
	{
		return NULL;
	}
	objc_property_t *list = calloc(sizeof(objc_property_t), count);
	unsigned int out = 0;
	for (struct objc_property_list *l=properties ; l!=NULL ; l=l->next)
	{
		for (int i=0 ; i<l->count ; i++)
		{
			list[out++] = property_at_index(l, i);
		}
	}
	*outCount = count;
	return list;
}